

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeCallQueue.cpp
# Opt level: O3

CallReader * xe::operator>>(CallReader *reader,string *value)

{
  uchar uVar1;
  pointer puVar2;
  
  value->_M_string_length = 0;
  *(value->_M_dataplus)._M_p = '\0';
  puVar2 = (reader->m_call->m_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 == (reader->m_call->m_data).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    puVar2 = (pointer)0x0;
  }
  uVar1 = puVar2[reader->m_curPos];
  reader->m_curPos = reader->m_curPos + 1;
  while (uVar1 != '\0') {
    std::__cxx11::string::push_back((char)value);
    puVar2 = (reader->m_call->m_data).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2 == (reader->m_call->m_data).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      puVar2 = (pointer)0x0;
    }
    uVar1 = puVar2[reader->m_curPos];
    reader->m_curPos = reader->m_curPos + 1;
  }
  return reader;
}

Assistant:

CallReader& operator>> (CallReader& reader, std::string& value)
{
	value.clear();
	for (;;)
	{
		char c;
		reader.read((deUint8*)&c, sizeof(char));
		if (c != 0)
			value.push_back(c);
		else
			break;
	}

	return reader;
}